

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O0

void write_phlab(char *dir,align_phseg_t *phseg,char *uttid,char *ctlspec,int32 fps)

{
  char *pcVar1;
  char *name;
  FILE *fp;
  char str [1024];
  int32 fps_local;
  char *ctlspec_local;
  char *uttid_local;
  align_phseg_t *phseg_local;
  char *dir_local;
  
  build_output_uttfile((char *)&fp,dir,uttid,ctlspec);
  strcat((char *)&fp,".lab");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
          ,0x228,"Writing xlabel style phone labels to: %s\n",&fp);
  name = (char *)fopen((char *)&fp,"w");
  phseg_local = (align_phseg_t *)dir;
  if ((FILE *)name == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                   ,0x22a,"Failed to open file %s for writing",&fp);
    name = _stdout;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
            ,0x22c,"Phone segmentation (%s):\n",uttid);
    phseg_local = (align_phseg_t *)0x0;
  }
  if (phseg_local == (align_phseg_t *)0x0) {
    fprintf((FILE *)name,"PH:%s>",uttid);
    fflush((FILE *)name);
  }
  fprintf((FILE *)name,"#\n");
  for (uttid_local = (char *)phseg; uttid_local != (char *)0x0;
      uttid_local = *(char **)(uttid_local + 0x10)) {
    pcVar1 = mdef_ciphone_str(kbc->mdef,kbc->mdef->phone[*(int *)uttid_local].ci);
    if (phseg_local == (align_phseg_t *)0x0) {
      fprintf((FILE *)name,"ph:%s>",uttid);
      fflush((FILE *)name);
    }
    fprintf((FILE *)name,"%0.6f 125 %s\n",(double)(int)*(short *)(uttid_local + 6) / (double)fps,
            pcVar1);
    fflush((FILE *)name);
  }
  if (phseg_local == (align_phseg_t *)0x0) {
    fprintf((FILE *)name,"\n");
    fflush((FILE *)name);
  }
  else {
    fclose((FILE *)name);
  }
  return;
}

Assistant:

static void
write_phlab(char *dir, align_phseg_t * phseg, char *uttid, char *ctlspec, int32 fps)
{
    char str[1024];
    FILE *fp;

    /* Attempt to write segmentation for this utt to a separate file */
    build_output_uttfile(str, dir, uttid, ctlspec);
    strcat(str, ".lab");
    E_INFO("Writing xlabel style phone labels to: %s\n", str);
    if ((fp = fopen(str, "w")) == NULL) {
        E_ERROR_SYSTEM("Failed to open file %s for writing", str);
        fp = stdout;            /* Segmentations can be directed to stdout this way */
        E_INFO("Phone segmentation (%s):\n", uttid);
        dir = NULL;             /* Flag to indicate fp shouldn't be closed at the end */
    }

    if (!dir) {
        fprintf(fp, "PH:%s>", uttid);
        fflush(fp);
    }
    fprintf(fp, "#\n");
    for (; phseg; phseg = phseg->next) {
        const char *name;

        name =
            mdef_ciphone_str(kbc->mdef, kbc->mdef->phone[phseg->pid].ci);

        if (!dir) {
            fprintf(fp, "ph:%s>", uttid);
            fflush(fp);
        }
        fprintf(fp, "%0.6f 125 %s\n", (double) phseg->ef / fps, name);
        fflush(fp);
    }

    if (dir)
        fclose(fp);
    else {
        fprintf(fp, "\n");
        fflush(fp);
    }
}